

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScl.c
# Opt level: O2

int Gia_ManSeqMarkUsed(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  int iVar3;
  int i;
  
  Gia_ManSetMark0(p);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  for (iVar3 = 0; iVar3 < p->vCis->nSize - p->nRegs; iVar3 = iVar3 + 1) {
    pGVar2 = Gia_ManCi(p,iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    pGVar2->field_0x3 = pGVar2->field_0x3 & 0xbf;
  }
  p_00 = Gia_ManCollectPoIds(p);
  iVar3 = 0;
  for (i = 0; i < p_00->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(p_00,i);
    pGVar2 = Gia_ManObj(p,iVar1);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ManSeqMarkUsed_rec(p,pGVar2,p_00);
    iVar3 = iVar3 + iVar1;
  }
  free(p_00->pArray);
  free(p_00);
  return iVar3;
}

Assistant:

int Gia_ManSeqMarkUsed( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Gia_ManSetMark0( p );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    vRoots = Gia_ManCollectPoIds( p );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        nNodes += Gia_ManSeqMarkUsed_rec( p, pObj, vRoots );
    Vec_IntFree( vRoots );
    return nNodes;
}